

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::XmlReporter::test_case_exception(XmlReporter *this,TestCaseException *e)

{
  ScopedElement *this_00;
  char *__s;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48 [32];
  undefined1 local_28 [16];
  lock_guard<std::mutex> lock;
  TestCaseException *e_local;
  XmlReporter *this_local;
  
  lock._M_device = (mutex_type *)e;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)(local_28 + 8),&this->mutex);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"Exception",&local_49);
  XmlWriter::scopedElement((XmlWriter *)local_28,(string *)&this->xml);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"crash",&local_81);
  this_00 = XmlWriter::ScopedElement::writeAttribute<bool>
                      ((ScopedElement *)local_28,&local_80,
                       (bool *)(((lock._M_device)->super___mutex_base)._M_mutex.__size + 0x18));
  __s = String::c_str((String *)lock._M_device);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,__s,&local_a9);
  XmlWriter::ScopedElement::writeText(this_00,&local_a8,true);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_28);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)(local_28 + 8));
  return;
}

Assistant:

void test_case_exception(const TestCaseException& e) override {
            std::lock_guard<std::mutex> lock(mutex);

            xml.scopedElement("Exception")
                    .writeAttribute("crash", e.is_crash)
                    .writeText(e.error_string.c_str());
        }